

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::AddPawnCaps<false,true>(Bitfoot *this,uint64_t dests)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_28;
  int local_24;
  int to;
  int from;
  uint64_t dest;
  uint64_t dests_local;
  Bitfoot *this_local;
  
  if ((dests != 0) && (this->pc[2] != 0)) {
    _to = dests & (this->pc[2] & 0xfefefefefefefefe) << 7 & this->pc[1];
    dest = dests;
    dests_local = (uint64_t)this;
    while (_to != 0) {
      local_24 = PopLowSquare((uint64_t *)&to,&local_28);
      local_24 = local_24 + -7;
      bVar4 = false;
      if ((&_board)[local_28] != 0) {
        bVar4 = ((&_board)[local_28] & 1) == 1;
      }
      if (!bVar4) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb55,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      bVar4 = Pinned<false>(this,local_24,local_28);
      iVar2 = local_24;
      iVar1 = local_28;
      if (!bVar4) {
        if (((&_BITMAP)[local_28] & 0xff00000000000000) == 0) {
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3,(&_board)[local_28],0);
        }
        else {
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,iVar2,iVar1,iVar3 + 0x3cf,(&_board)[local_28],10);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3 + 500,(&_board)[local_28],8);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,iVar2,iVar1,iVar3 + 0x140,(&_board)[local_28],6);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3 + 300,(&_board)[local_28],4);
        }
      }
    }
    _to = dest & (this->pc[2] & 0x7f7f7f7f7f7f7f7f) << 9 & this->pc[1];
    while (_to != 0) {
      local_24 = PopLowSquare((uint64_t *)&to,&local_28);
      local_24 = local_24 + -9;
      bVar4 = false;
      if ((&_board)[local_28] != 0) {
        bVar4 = ((&_board)[local_28] & 1) == 1;
      }
      if (!bVar4) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb76,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      bVar4 = Pinned<false>(this,local_24,local_28);
      iVar2 = local_24;
      iVar1 = local_28;
      if (!bVar4) {
        if (((&_BITMAP)[local_28] & 0xff00000000000000) == 0) {
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3,(&_board)[local_28],0);
        }
        else {
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,iVar2,iVar1,iVar3 + 0x3cf,(&_board)[local_28],10);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3 + 500,(&_board)[local_28],8);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,iVar2,iVar1,iVar3 + 0x140,(&_board)[local_28],6);
          iVar2 = local_24;
          iVar1 = local_28;
          iVar3 = ValueOf((&_board)[local_28]);
          AddMove<false,(bitfoot::MoveType)4>(this,2,iVar2,iVar1,iVar3 + 300,(&_board)[local_28],4);
        }
      }
    }
  }
  return;
}

Assistant:

inline void AddPawnCaps(const uint64_t dests) {
    if (!dests || !pc[color|Pawn]) {
      return;
    }

    uint64_t dest;
    int from;
    int to;

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) >> 9) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) << 7) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthEast : SouthEast));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) >> 7) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) << 9) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthWest : SouthWest));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }
  }